

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantize.c
# Opt level: O1

int fits_img_stats_int(int *array,long nx,long ny,int nullcheck,int nullvalue,long *ngoodpix,
                      int *minvalue,int *maxvalue,double *mean,double *sigma,double *noise1,
                      double *noise2,double *noise3,double *noise5,int *status)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  long ii;
  ulong uVar5;
  void *__ptr;
  double *pdVar6;
  ulong uVar7;
  size_t __nmemb;
  double *arr;
  double *arr_00;
  double *__ptr_00;
  double *__base;
  double *__base_00;
  size_t sVar8;
  size_t sVar9;
  LONGLONG LVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  int *piVar14;
  int *piVar15;
  uint uVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  size_t sVar22;
  uint uVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  int iVar27;
  size_t __nmemb_00;
  ulong uVar28;
  bool bVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  size_t local_d0;
  uint local_ac;
  size_t local_90;
  uint local_88;
  uint local_84;
  size_t local_80;
  long local_78;
  long local_70;
  uint local_64;
  
  uVar18 = nx;
  if (mean != (double *)0x0 || sigma != (double *)0x0) {
    uVar5 = ny * nx;
    if (nullcheck == 0) {
      if ((long)uVar5 < 1) goto LAB_001f9bb2;
      dVar30 = 0.0;
      lVar21 = 0;
      dVar32 = 0.0;
      do {
        dVar31 = (double)array[lVar21];
        dVar32 = dVar32 + dVar31;
        dVar30 = dVar30 + dVar31 * dVar31;
        lVar21 = lVar21 + 1;
        uVar18 = uVar5;
      } while (uVar5 - lVar21 != 0);
    }
    else if ((long)uVar5 < 1) {
      uVar5 = 0;
LAB_001f9bb2:
      dVar32 = 0.0;
      dVar30 = 0.0;
      uVar18 = uVar5;
    }
    else {
      dVar30 = 0.0;
      uVar18 = 0;
      dVar32 = 0.0;
      lVar21 = 0;
      do {
        if (array[lVar21] != nullvalue) {
          dVar31 = (double)array[lVar21];
          uVar18 = uVar18 + 1;
          dVar32 = dVar32 + dVar31;
          dVar30 = dVar30 + dVar31 * dVar31;
        }
        lVar21 = lVar21 + 1;
      } while (uVar5 - lVar21 != 0);
    }
    if ((long)uVar18 < 2) {
      dVar30 = 0.0;
      bVar29 = uVar18 == 1;
      uVar18 = (ulong)bVar29;
      if (!bVar29) {
        dVar32 = 0.0;
      }
    }
    else {
      dVar32 = dVar32 / (double)(long)uVar18;
      dVar30 = dVar30 / (double)(long)uVar18 - dVar32 * dVar32;
      if (dVar30 < 0.0) {
        dVar30 = sqrt(dVar30);
      }
      else {
        dVar30 = SQRT(dVar30);
      }
    }
    if (ngoodpix != (long *)0x0) {
      *ngoodpix = uVar18;
    }
    if (mean != (double *)0x0) {
      *mean = dVar32;
    }
    if (sigma != (double *)0x0) {
      *sigma = dVar30;
    }
  }
  if (noise1 != (double *)0x0) {
    dVar30 = 0.0;
    if (2 < nx) {
      __ptr = calloc(nx,4);
      if (__ptr != (void *)0x0) {
        pdVar6 = (double *)calloc(ny,8);
        if (pdVar6 != (double *)0x0) {
          if (ny < 1) {
            local_d0 = 0;
          }
          else {
            local_d0 = 0;
            lVar21 = 0;
            piVar15 = array;
            do {
              lVar13 = 0;
              lVar11 = lVar13;
              if (nullcheck != 0) {
                do {
                  lVar11 = lVar13;
                  if (piVar15[lVar13] != nullvalue) break;
                  lVar13 = lVar13 + 1;
                  lVar11 = nx;
                } while (nx != lVar13);
              }
              if (lVar11 != nx) {
                lVar13 = lVar11 + 1;
                if (lVar13 < nx) {
                  piVar14 = array + lVar21 * nx + lVar11;
                  uVar5 = 0;
                  do {
                    lVar11 = lVar13;
                    if ((nullcheck != 0) && (lVar13 < nx)) {
                      do {
                        lVar11 = lVar13;
                        if (piVar15[lVar13] != nullvalue) break;
                        lVar13 = lVar13 + 1;
                        lVar11 = nx;
                      } while (nx != lVar13);
                    }
                    if (lVar11 == nx) break;
                    iVar27 = *piVar14;
                    piVar14 = array + lVar21 * nx + lVar11;
                    *(int *)((long)__ptr + uVar5 * 4) = iVar27 - *piVar14;
                    uVar5 = uVar5 + 1;
                    lVar13 = lVar11 + 1;
                  } while (lVar13 < nx);
                }
                else {
                  uVar5 = 0;
                }
                if (1 < uVar5) {
                  dVar30 = 0.0;
                  dVar32 = 0.0;
                  uVar7 = 0;
                  do {
                    dVar31 = (double)*(int *)((long)__ptr + uVar7 * 4);
                    dVar32 = dVar32 + dVar31;
                    dVar30 = dVar30 + dVar31 * dVar31;
                    uVar7 = uVar7 + 1;
                  } while (uVar5 != uVar7);
                  dVar32 = dVar32 / (double)(long)uVar5;
                  dVar30 = dVar30 / (double)(long)uVar5 - dVar32 * dVar32;
                  if (dVar30 < 0.0) {
                    dVar30 = sqrt(dVar30);
                  }
                  else {
                    dVar30 = SQRT(dVar30);
                  }
                  if (0.0 < dVar30) {
                    iVar27 = 0;
                    do {
                      if ((long)uVar5 < 1) {
                        uVar28 = 0;
                      }
                      else {
                        uVar7 = 0;
                        uVar28 = 0;
                        do {
                          iVar1 = *(int *)((long)__ptr + uVar7 * 4);
                          if (ABS((double)iVar1 - dVar32) < dVar30 * 5.0) {
                            if ((long)uVar28 < (long)uVar7) {
                              *(int *)((long)__ptr + uVar28 * 4) = iVar1;
                            }
                            uVar28 = uVar28 + 1;
                          }
                          uVar7 = uVar7 + 1;
                        } while (uVar5 != uVar7);
                      }
                      if (uVar28 == uVar5) break;
                      if ((long)uVar28 < 1) {
                        dVar32 = 0.0;
                        dVar30 = 0.0;
                      }
                      else {
                        dVar30 = 0.0;
                        dVar32 = 0.0;
                        uVar5 = 0;
                        do {
                          dVar31 = (double)*(int *)((long)__ptr + uVar5 * 4);
                          dVar32 = dVar32 + dVar31;
                          dVar30 = dVar30 + dVar31 * dVar31;
                          uVar5 = uVar5 + 1;
                        } while (uVar28 != uVar5);
                      }
                      if ((long)uVar28 < 2) {
                        dVar30 = 0.0;
                        if (uVar28 != 1) {
                          dVar32 = 0.0;
                        }
                      }
                      else {
                        dVar32 = dVar32 / (double)(long)uVar28;
                        dVar30 = dVar30 / (double)(long)uVar28 - dVar32 * dVar32;
                        if (dVar30 < 0.0) {
                          dVar30 = sqrt(dVar30);
                        }
                        else {
                          dVar30 = SQRT(dVar30);
                        }
                      }
                      iVar27 = iVar27 + 1;
                      uVar5 = uVar28;
                    } while (iVar27 != 3);
                  }
                  pdVar6[local_d0] = dVar30;
                  local_d0 = local_d0 + 1;
                }
              }
              lVar21 = lVar21 + 1;
              piVar15 = piVar15 + nx;
            } while (lVar21 != ny);
          }
          if (local_d0 == 0) {
            dVar30 = 0.0;
          }
          else if (local_d0 == 1) {
            dVar30 = *pdVar6;
          }
          else {
            qsort(pdVar6,local_d0,8,FnCompare_double);
            dVar30 = (*(double *)
                       ((long)pdVar6 +
                       ((local_d0 - ((long)(local_d0 - 1) >> 0x3f)) - 1 & 0xfffffffffffffffe) * 4) +
                     *(double *)
                      ((long)pdVar6 + (local_d0 - ((long)local_d0 >> 0x3f) & 0xfffffffffffffffe) * 4
                      )) * 0.5;
          }
          dVar30 = dVar30 * 0.70710678;
          free(pdVar6);
          free(__ptr);
          goto LAB_001fa069;
        }
        free(__ptr);
      }
      *status = 0x71;
      dVar30 = 0.0;
    }
LAB_001fa069:
    *noise1 = dVar30;
  }
  if ((minvalue == (int *)0x0 && maxvalue == (int *)0x0) && noise3 == (double *)0x0)
  goto LAB_001fa87e;
  lVar21 = 1;
  __nmemb = ny;
  if (nx < 9) {
    __nmemb = 1;
    lVar21 = ny;
  }
  __nmemb_00 = lVar21 * nx;
  if ((long)__nmemb_00 < 9) {
    dVar31 = 0.0;
    if ((long)__nmemb_00 < 1) {
      uVar26 = 0x80000000;
      uVar16 = 0x7fffffff;
      uVar18 = 0;
    }
    else {
      uVar16 = 0x7fffffff;
      uVar26 = 0x80000000;
      lVar21 = 0;
      uVar18 = 0;
      do {
        if ((nullcheck == 0) || (array[lVar21] != nullvalue)) {
          uVar17 = array[lVar21];
          if ((int)uVar17 < (int)uVar16) {
            uVar16 = uVar17;
          }
          if ((int)uVar26 < (int)uVar17) {
            uVar26 = uVar17;
          }
          uVar18 = uVar18 + 1;
        }
        lVar21 = lVar21 + 1;
      } while (__nmemb_00 - lVar21 != 0);
    }
    dVar30 = 0.0;
    dVar32 = 0.0;
  }
  else {
    pdVar6 = (double *)calloc(__nmemb_00,8);
    if (pdVar6 != (double *)0x0) {
      arr = (double *)calloc(__nmemb_00,8);
      if (arr != (double *)0x0) {
        arr_00 = (double *)calloc(__nmemb_00,8);
        if (arr_00 == (double *)0x0) {
          free(pdVar6);
          pdVar6 = arr;
        }
        else {
          __ptr_00 = (double *)calloc(__nmemb,8);
          if (__ptr_00 == (double *)0x0) {
            free(pdVar6);
            free(arr);
            pdVar6 = arr_00;
          }
          else {
            __base = (double *)calloc(__nmemb,8);
            if (__base == (double *)0x0) {
              free(pdVar6);
              free(arr);
              free(arr_00);
              pdVar6 = __ptr_00;
            }
            else {
              __base_00 = (double *)calloc(__nmemb,8);
              if (__base_00 != (double *)0x0) {
                if ((long)__nmemb < 1) {
                  uVar26 = 0x80000000;
                  uVar16 = 0x7fffffff;
                  uVar18 = 0;
                  local_90 = 0;
                  local_80 = 0;
                }
                else {
                  uVar17 = 0x7fffffff;
                  uVar16 = 0x7fffffff;
                  uVar19 = 0x80000000;
                  uVar26 = 0x80000000;
                  sVar22 = 0;
                  local_80 = 0;
                  local_90 = 0;
                  uVar18 = 0;
                  piVar15 = array;
                  do {
                    sVar8 = 0;
                    sVar9 = sVar8;
                    if (nullcheck != 0) {
                      do {
                        sVar9 = sVar8;
                        if (piVar15[sVar8] != nullvalue) break;
                        sVar8 = sVar8 + 1;
                        sVar9 = __nmemb_00;
                      } while (__nmemb_00 - sVar8 != 0);
                    }
                    if (sVar9 != __nmemb_00) {
                      lVar11 = sVar22 * __nmemb_00;
                      uVar12 = array[lVar11 + sVar9];
                      bVar29 = (int)uVar12 < (int)uVar16;
                      uVar16 = uVar17;
                      if (bVar29) {
                        uVar16 = uVar12;
                      }
                      bVar29 = (int)uVar26 < (int)uVar12;
                      uVar26 = uVar19;
                      if (bVar29) {
                        uVar26 = uVar12;
                      }
                      sVar9 = sVar9 + 1;
                      sVar8 = sVar9;
                      if ((nullcheck != 0) && ((long)sVar9 < (long)__nmemb_00)) {
                        do {
                          sVar8 = sVar9;
                          if (piVar15[sVar9] != nullvalue) break;
                          sVar9 = sVar9 + 1;
                          sVar8 = __nmemb_00;
                        } while (__nmemb_00 - sVar9 != 0);
                      }
                      if (sVar8 == __nmemb_00) {
                        uVar18 = uVar18 + 1;
                        uVar17 = uVar16;
                        uVar19 = uVar26;
                      }
                      else {
                        uVar17 = array[lVar11 + sVar8];
                        if ((int)uVar17 < (int)uVar16) {
                          uVar16 = uVar17;
                        }
                        if ((int)uVar26 < (int)uVar17) {
                          uVar26 = uVar17;
                        }
                        sVar8 = sVar8 + 1;
                        sVar9 = sVar8;
                        if ((nullcheck != 0) && ((long)sVar8 < (long)__nmemb_00)) {
                          do {
                            sVar9 = sVar8;
                            if (piVar15[sVar8] != nullvalue) break;
                            sVar8 = sVar8 + 1;
                            sVar9 = __nmemb_00;
                          } while (__nmemb_00 - sVar8 != 0);
                        }
                        if (sVar9 == __nmemb_00) {
                          uVar18 = uVar18 + 2;
                          uVar17 = uVar16;
                          uVar19 = uVar26;
                        }
                        else {
                          uVar19 = array[lVar11 + sVar9];
                          if ((int)uVar19 < (int)uVar16) {
                            uVar16 = uVar19;
                          }
                          if ((int)uVar26 < (int)uVar19) {
                            uVar26 = uVar19;
                          }
                          sVar9 = sVar9 + 1;
                          sVar8 = sVar9;
                          if ((nullcheck != 0) && ((long)sVar9 < (long)__nmemb_00)) {
                            do {
                              sVar8 = sVar9;
                              if (piVar15[sVar9] != nullvalue) break;
                              sVar9 = sVar9 + 1;
                              sVar8 = __nmemb_00;
                            } while (__nmemb_00 - sVar9 != 0);
                          }
                          if (sVar8 == __nmemb_00) {
                            uVar18 = uVar18 + 3;
                            uVar17 = uVar16;
                            uVar19 = uVar26;
                          }
                          else {
                            local_ac = array[lVar11 + sVar8];
                            if ((int)local_ac < (int)uVar16) {
                              uVar16 = local_ac;
                            }
                            if ((int)uVar26 < (int)local_ac) {
                              uVar26 = local_ac;
                            }
                            sVar8 = sVar8 + 1;
                            sVar9 = sVar8;
                            if ((nullcheck != 0) && ((long)sVar8 < (long)__nmemb_00)) {
                              do {
                                sVar9 = sVar8;
                                if (piVar15[sVar8] != nullvalue) break;
                                sVar8 = sVar8 + 1;
                                sVar9 = __nmemb_00;
                              } while (__nmemb_00 - sVar8 != 0);
                            }
                            if (sVar9 == __nmemb_00) {
                              uVar18 = uVar18 + 4;
                              uVar17 = uVar16;
                              uVar19 = uVar26;
                            }
                            else {
                              local_64 = array[lVar11 + sVar9];
                              if ((int)local_64 < (int)uVar16) {
                                uVar16 = local_64;
                              }
                              if ((int)uVar26 < (int)local_64) {
                                uVar26 = local_64;
                              }
                              sVar9 = sVar9 + 1;
                              sVar8 = sVar9;
                              if ((nullcheck != 0) && ((long)sVar9 < (long)__nmemb_00)) {
                                do {
                                  sVar8 = sVar9;
                                  if (piVar15[sVar9] != nullvalue) break;
                                  sVar9 = sVar9 + 1;
                                  sVar8 = __nmemb_00;
                                } while (__nmemb_00 - sVar9 != 0);
                              }
                              if (sVar8 == __nmemb_00) {
                                uVar18 = uVar18 + 5;
                                uVar17 = uVar16;
                                uVar19 = uVar26;
                              }
                              else {
                                local_84 = array[lVar11 + sVar8];
                                if ((int)local_84 < (int)uVar16) {
                                  uVar16 = local_84;
                                }
                                if ((int)uVar26 < (int)local_84) {
                                  uVar26 = local_84;
                                }
                                sVar8 = sVar8 + 1;
                                sVar9 = sVar8;
                                if ((nullcheck != 0) && ((long)sVar8 < (long)__nmemb_00)) {
                                  do {
                                    sVar9 = sVar8;
                                    if (piVar15[sVar8] != nullvalue) break;
                                    sVar8 = sVar8 + 1;
                                    sVar9 = __nmemb_00;
                                  } while (__nmemb_00 - sVar8 != 0);
                                }
                                if (sVar9 == __nmemb_00) {
                                  uVar18 = uVar18 + 6;
                                  uVar17 = uVar16;
                                  uVar19 = uVar26;
                                }
                                else {
                                  uVar2 = array[lVar11 + sVar9];
                                  if ((int)uVar2 < (int)uVar16) {
                                    uVar16 = uVar2;
                                  }
                                  if ((int)uVar26 < (int)uVar2) {
                                    uVar26 = uVar2;
                                  }
                                  sVar9 = sVar9 + 1;
                                  sVar8 = sVar9;
                                  if ((nullcheck != 0) && ((long)sVar9 < (long)__nmemb_00)) {
                                    do {
                                      sVar8 = sVar9;
                                      if (piVar15[sVar9] != nullvalue) break;
                                      sVar9 = sVar9 + 1;
                                      sVar8 = __nmemb_00;
                                    } while (__nmemb_00 - sVar9 != 0);
                                  }
                                  if (sVar8 == __nmemb_00) {
                                    uVar18 = uVar18 + 7;
                                    uVar17 = uVar16;
                                    uVar19 = uVar26;
                                  }
                                  else {
                                    local_88 = array[lVar11 + sVar8];
                                    lVar13 = uVar18 + 8;
                                    if ((int)local_88 < (int)uVar16) {
                                      uVar16 = local_88;
                                    }
                                    if ((int)uVar26 < (int)local_88) {
                                      uVar26 = local_88;
                                    }
                                    sVar8 = sVar8 + 1;
                                    if ((long)sVar8 < (long)__nmemb_00) {
                                      local_70 = 0;
                                      local_78 = 0;
                                      do {
                                        uVar23 = uVar2;
                                        uVar4 = local_64;
                                        uVar2 = local_ac;
                                        local_ac = local_64;
                                        sVar9 = sVar8;
                                        if ((nullcheck != 0) && ((long)sVar8 < (long)__nmemb_00)) {
                                          do {
                                            sVar9 = sVar8;
                                            if (piVar15[sVar8] != nullvalue) break;
                                            sVar8 = sVar8 + 1;
                                            sVar9 = __nmemb_00;
                                          } while (__nmemb_00 - sVar8 != 0);
                                        }
                                        if (sVar9 == __nmemb_00) break;
                                        uVar3 = array[lVar11 + sVar9];
                                        if ((int)uVar3 < (int)uVar16) {
                                          uVar16 = uVar3;
                                        }
                                        if ((int)uVar26 < (int)uVar3) {
                                          uVar26 = uVar3;
                                        }
                                        uVar20 = local_64 ^ local_84;
                                        local_64 = local_84;
                                        lVar24 = (long)(int)uVar4;
                                        if (uVar20 != 0 || (local_84 ^ uVar23) != 0) {
                                          uVar5 = lVar24 - (int)uVar23;
                                          uVar18 = -uVar5;
                                          if (0 < (long)uVar5) {
                                            uVar18 = uVar5;
                                          }
                                          pdVar6[local_78] = (double)(uVar18 & 0xffffffff);
                                          local_78 = local_78 + 1;
                                        }
                                        if ((uVar20 == 0 && (uVar2 == uVar4 && uVar19 == uVar2)) &&
                                            (local_84 ^ uVar23) == 0) {
                                          lVar13 = lVar13 + 1;
                                        }
                                        else {
                                          lVar25 = (long)(int)uVar19 + (long)(int)uVar23;
                                          dVar32 = (double)(lVar24 * 2 - lVar25);
                                          dVar30 = (double)-(long)dVar32;
                                          if (0 < (long)dVar32) {
                                            dVar30 = dVar32;
                                          }
                                          arr[local_70] = dVar30;
                                          dVar32 = (double)((long)(int)uVar12 + lVar24 * 6 +
                                                            lVar25 * -4 + (long)(int)uVar3);
                                          dVar30 = (double)-(long)dVar32;
                                          if (0 < (long)dVar32) {
                                            dVar30 = dVar32;
                                          }
                                          arr_00[local_70] = dVar30;
                                          local_70 = local_70 + 1;
                                        }
                                        sVar8 = sVar9 + 1;
                                        uVar12 = uVar17;
                                        uVar17 = uVar19;
                                        uVar19 = uVar2;
                                        uVar2 = local_88;
                                        local_88 = uVar3;
                                        local_84 = uVar23;
                                      } while ((long)sVar8 < (long)__nmemb_00);
                                    }
                                    else {
                                      local_78 = 0;
                                      local_70 = 0;
                                    }
                                    uVar18 = lVar13 + local_70;
                                    uVar17 = uVar16;
                                    uVar19 = uVar26;
                                    if (local_70 != 0) {
                                      if (local_70 == 1) {
                                        if (local_78 == 1) {
                                          __ptr_00[local_90] = (double)(long)*pdVar6;
                                          local_90 = local_90 + 1;
                                        }
                                        __base[local_80] = (double)(long)*arr;
                                        dVar30 = *arr_00;
                                      }
                                      else {
                                        iVar27 = (int)local_70;
                                        if (1 < local_78) {
                                          LVar10 = quick_select_longlong((LONGLONG *)pdVar6,iVar27);
                                          __ptr_00[local_90] = (double)LVar10;
                                          local_90 = local_90 + 1;
                                        }
                                        LVar10 = quick_select_longlong((LONGLONG *)arr,iVar27);
                                        __base[local_80] = (double)LVar10;
                                        dVar30 = (double)quick_select_longlong
                                                                   ((LONGLONG *)arr_00,iVar27);
                                      }
                                      __base_00[local_80] = (double)(long)dVar30;
                                      local_80 = local_80 + 1;
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    sVar22 = sVar22 + 1;
                    piVar15 = piVar15 + lVar21 * nx;
                  } while (sVar22 != __nmemb);
                }
                dVar30 = 0.0;
                dVar32 = 0.0;
                if (local_80 != 0) {
                  if (local_80 == 1) {
                    dVar30 = *__base;
                    dVar32 = *__base_00;
                  }
                  else {
                    qsort(__base,local_80,8,FnCompare_double);
                    qsort(__base_00,local_80,8,FnCompare_double);
                    lVar21 = ((local_80 - ((long)(local_80 - 1) >> 0x3f)) - 1 & 0x3ffffffffffffffe)
                             * 4;
                    lVar11 = (local_80 - ((long)local_80 >> 0x3f) & 0x3ffffffffffffffe) * 4;
                    dVar30 = (*(double *)((long)__base + lVar21) +
                             *(double *)((long)__base + lVar11)) * 0.5;
                    dVar32 = (*(double *)((long)__base_00 + lVar21) +
                             *(double *)((long)__base_00 + lVar11)) * 0.5;
                  }
                }
                dVar31 = 0.0;
                if (local_90 != 0) {
                  if (local_90 == 1) {
                    dVar31 = *__ptr_00;
                  }
                  else {
                    qsort(__ptr_00,local_90,8,FnCompare_double);
                    dVar31 = (*(double *)
                               ((long)__ptr_00 +
                               ((local_90 - ((long)(local_90 - 1) >> 0x3f)) - 1 & 0xfffffffffffffffe
                               ) * 4) +
                             *(double *)
                              ((long)__ptr_00 +
                              (local_90 - ((long)local_90 >> 0x3f) & 0xfffffffffffffffe) * 4)) * 0.5
                    ;
                  }
                }
                dVar31 = dVar31 * 1.0483579;
                dVar30 = dVar30 * 0.6052697;
                dVar32 = dVar32 * 0.1772048;
                free(__base_00);
                free(__base);
                free(__ptr_00);
                free(arr_00);
                free(arr);
                free(pdVar6);
                goto LAB_001fa83b;
              }
              free(pdVar6);
              free(arr);
              free(arr_00);
              free(__ptr_00);
              pdVar6 = __base;
            }
          }
        }
      }
      free(pdVar6);
    }
    *status = 0x71;
    dVar31 = 0.0;
    uVar16 = 0;
    uVar26 = 0;
    dVar30 = 0.0;
    dVar32 = 0.0;
  }
LAB_001fa83b:
  if (ngoodpix != (long *)0x0) {
    *ngoodpix = uVar18;
  }
  if (minvalue != (int *)0x0) {
    *minvalue = uVar16;
  }
  if (maxvalue != (int *)0x0) {
    *maxvalue = uVar26;
  }
  if (noise2 != (double *)0x0) {
    *noise2 = dVar31;
  }
  if (noise3 != (double *)0x0) {
    *noise3 = dVar30;
  }
  if (noise5 != (double *)0x0) {
    *noise5 = dVar32;
  }
LAB_001fa87e:
  return *status;
}

Assistant:

int fits_img_stats_int(int *array, /*  2 dimensional array of image pixels */
        long nx,            /* number of pixels in each row of the image */
	long ny,            /* number of rows in the image */
	                    /* (if this is a 3D image, then ny should be the */
			    /* product of the no. of rows times the no. of planes) */
	int nullcheck,      /* check for null values, if true */
	int nullvalue,    /* value of null pixels, if nullcheck is true */

   /* returned parameters (if the pointer is not null)  */
	long *ngoodpix,     /* number of non-null pixels in the image */
	int *minvalue,    /* returned minimum non-null value in the array */
	int *maxvalue,    /* returned maximum non-null value in the array */
	double *mean,       /* returned mean value of all non-null pixels */
	double *sigma,      /* returned R.M.S. value of all non-null pixels */
	double *noise1,     /* 1st order estimate of noise in image background level */
	double *noise2,     /* 2nd order estimate of noise in image background level */
	double *noise3,     /* 3rd order estimate of noise in image background level */
	double *noise5,     /* 5th order estimate of noise in image background level */
	int *status)        /* error status */

/*
    Compute statistics of the input integer image.
*/
{
	long ngood;
	int minval = 0, maxval = 0;
	double xmean = 0., xsigma = 0., xnoise = 0., xnoise2 = 0., xnoise3 = 0., xnoise5 = 0.;

	/* need to calculate mean and/or sigma and/or limits? */
	if (mean || sigma ) {
		FnMeanSigma_int(array, nx * ny, nullcheck, nullvalue, 
			&ngood, &xmean, &xsigma, status);

	    if (ngoodpix) *ngoodpix = ngood;
	    if (mean)     *mean = xmean;
	    if (sigma)    *sigma = xsigma;
	}

	if (noise1) {
		FnNoise1_int(array, nx, ny, nullcheck, nullvalue, 
		  &xnoise, status);

		*noise1  = xnoise;
	}

	if (minvalue || maxvalue || noise3) {
		FnNoise5_int(array, nx, ny, nullcheck, nullvalue, 
			&ngood, &minval, &maxval, &xnoise2, &xnoise3, &xnoise5, status);

		if (ngoodpix) *ngoodpix = ngood;
		if (minvalue) *minvalue= minval;
		if (maxvalue) *maxvalue = maxval;
		if (noise2) *noise2  = xnoise2;
		if (noise3) *noise3  = xnoise3;
		if (noise5) *noise5  = xnoise5;
	}
	return(*status);
}